

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubD::IsValid(ON_SubD *this,ON_TextLog *text_logx)

{
  ON_SubDimple *this_00;
  bool bSilentError_00;
  ON_SubDimple *subdimple;
  ON_TextLog *text_log;
  bool bSilentError;
  ON__INT_PTR hightbits;
  ON__INT_PTR lowbit;
  ON_TextLog *text_logx_local;
  ON_SubD *this_local;
  
  bSilentError_00 = ((ulong)text_logx & 1) != 0;
  this_00 = SubDimple(this);
  if (this_00 == (ON_SubDimple *)0x0) {
    this_local._7_1_ = ON_SubDIsNotValid(bSilentError_00);
  }
  else {
    this_local._7_1_ =
         ON_SubDimple::IsValid
                   (this_00,this,bSilentError_00,
                    (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe));
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::IsValid(ON_TextLog* text_logx) const
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // subd is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  const bool bSilentError = (0 != (lowbit & ((ON__INT_PTR)text_logx)));
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);
  
  const ON_SubDimple* subdimple = SubDimple();
  if (nullptr == subdimple)
    return ON_SubDIsNotValid(bSilentError);

  return subdimple->IsValid(*this, bSilentError, text_log);
}